

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O3

TPZGeoEl * __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoLinear>::Clone
          (TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *this,TPZGeoMesh *DestMesh)

{
  atomic_int *paVar1;
  TPZGeoMesh *pTVar2;
  TPZReference *pTVar3;
  TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *this_00;
  
  pTVar2 = (this->super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>).super_TPZGeoEl.fMesh;
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *)operator_new(200);
  if (pTVar2 == DestMesh) {
    *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>).super_TPZGeoEl =
         &PTR__TPZSavable_0187e9d0;
    TPZGeoElRefLess<pzgeom::TPZGeoLinear>::TPZGeoElRefLess
              ((TPZGeoElRefLess<pzgeom::TPZGeoLinear> *)this_00,&PTR_PTR_0187c308,
               &this->super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>);
    *(undefined ***)&(this_00->super_TPZGeoElRefLess<pzgeom::TPZGeoLinear>).super_TPZGeoEl =
         &PTR__TPZGeoElRefPattern_0187c008;
    TPZVec<long>::TPZVec(&this_00->fSubEl,&this->fSubEl);
    pTVar3 = (this->fRefPattern).fRef;
    (this_00->fRefPattern).fRef = pTVar3;
    LOCK();
    paVar1 = &pTVar3->fCounter;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  else {
    TPZGeoElRefPattern(this_00,DestMesh,this);
  }
  return (TPZGeoEl *)this_00;
}

Assistant:

TPZGeoEl * TPZGeoElRefPattern<TGeo>::Clone(TPZGeoMesh &DestMesh) const{
    if(&DestMesh == this->Mesh())
    {
        return new TPZGeoElRefPattern<TGeo>(*this);
    }
    else
    {
        return new TPZGeoElRefPattern<TGeo>(DestMesh, *this);
    }
}